

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

void kratos::GeneratorPortVisitor::process_port(Generator *generator,Port *port,string *port_name)

{
  PortType PVar1;
  _Hash_node_base *p_Var2;
  pointer ppVar3;
  vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
  *pvVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  long lVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Var *pVVar9;
  long lVar10;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Generator *pGVar11;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  InternalException *this;
  GeneratorException *pGVar12;
  __hash_code __code;
  undefined1 auVar13 [8];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  __node_base_ptr p_Var14;
  __node_base_ptr p_Var15;
  pointer ppVar16;
  long *plVar17;
  bool bVar18;
  shared_ptr<kratos::PortPackedStruct> sVar19;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_e8;
  undefined1 local_d0 [8];
  shared_ptr<kratos::Var> var;
  string new_name;
  undefined1 auStack_90 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  undefined1 auStack_78 [8];
  shared_ptr<kratos::PortPackedStruct> packed_1;
  allocator_type local_59;
  undefined1 auStack_58 [8];
  shared_ptr<kratos::PortPackedStruct> packed;
  undefined1 local_38 [8];
  
  if (port->direction_ != Out) {
    if (port->direction_ != In) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&new_name._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 "Not implement yet","");
      InternalException::InternalException
                (this,(string *)
                      &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar6 = (*(port->super_Var).super_IRNode._vptr_IRNode[0x10])(port);
    if (*(long *)(CONCAT44(extraout_var,iVar6) + 0x18) == 1) {
      lVar10 = *(long *)(CONCAT44(extraout_var,iVar6) + 0x10);
      lVar8 = (**(code **)(**(long **)(lVar10 + 8) + 0x20))();
      if ((*(int *)(lVar8 + 0x48) != 0) || (*(Port **)(*(long *)(lVar10 + 8) + 0xc0) != port))
      goto LAB_00223426;
      pvVar4 = *(vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                 **)(*(long *)(lVar10 + 8) + 200);
      auVar13 = (undefined1  [8])pvVar4;
      if (*(int *)(pvVar4 + 0x168) == 6) {
        Var::as<kratos::VarCasted>
                  ((Var *)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
        auVar13 = (undefined1  [8])
                  *(vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                    **)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi[0x27]._M_use_count;
        if (new_name._M_dataplus._M_p != (pointer)0x0) {
          local_38 = (undefined1  [8])
                     *(vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                       **)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi[0x27]._M_use_count;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)new_name._M_dataplus._M_p);
          auVar13 = local_38;
        }
      }
      switch(*(undefined4 *)((long)auVar13 + 0x168)) {
      case 0:
      case 3:
      case 5:
        goto switchD_00223adc_caseD_0;
      case 4:
        local_38 = (undefined1  [8])(**(code **)(*(long *)auVar13 + 0x20))(auVar13);
        iVar6 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
        if (local_38 == (undefined1  [8])CONCAT44(extraout_var_06,iVar6))
        goto switchD_00223adc_caseD_0;
      }
      if (*(int *)(pvVar4 + 0x168) == 2) {
        local_38 = (undefined1  [8])(**(code **)(*(long *)pvVar4 + 0x68))(pvVar4);
        iVar6 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
        if (local_38 == (undefined1  [8])CONCAT44(extraout_var_07,iVar6)) {
switchD_00223adc_caseD_0:
          pGVar11 = (Generator *)(**(code **)(*(long *)pvVar4 + 0x68))(pvVar4);
          var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar10 + 8);
          new_name._M_dataplus._M_p = *(pointer *)(lVar10 + 0x10);
          if (new_name._M_dataplus._M_p != (pointer)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(new_name._M_dataplus._M_p + 8) = *(int *)(new_name._M_dataplus._M_p + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(new_name._M_dataplus._M_p + 8) = *(int *)(new_name._M_dataplus._M_p + 8) + 1;
            }
          }
          Generator::remove_stmt
                    (pGVar11,(shared_ptr<kratos::Stmt> *)
                             &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
          if (new_name._M_dataplus._M_p == (pointer)0x0) {
            return;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)new_name._M_dataplus._M_p);
          return;
        }
      }
    }
LAB_00223426:
    iVar6 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
    pGVar11 = (Generator *)CONCAT44(extraout_var_00,iVar6);
    if (pGVar11 == (Generator *)0x0) {
      pGVar12 = (GeneratorException *)__cxa_allocate_exception(0x10);
      auStack_58 = (undefined1  [8])(generator->name)._M_dataplus._M_p;
      packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(generator->name)._M_string_length;
      format_str.size_ = 0xd;
      format_str.data_ = (char *)0x2f;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)auStack_58;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (detail *)"{0}\'s parent is empty but it\'s not a top module",format_str,args);
      __l._M_len = 1;
      __l._M_array = (iterator)auStack_78;
      auStack_78 = (undefined1  [8])generator;
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58,__l,
                 (allocator_type *)&local_e8);
      GeneratorException::GeneratorException
                (pGVar12,(string *)
                         &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                 (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58);
      __cxa_throw(pGVar12,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
    }
    Generator::get_unique_variable_name
              ((string *)
               &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pGVar11,
               &generator->instance_name,port_name);
    iVar6 = (*(port->super_Var).super_IRNode._vptr_IRNode[0x17])(port);
    if ((char)iVar6 == '\0') {
      pVVar9 = Generator::var(pGVar11,(string *)
                                      &var.
                                       super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount,(port->super_Var).var_width_,
                              &(port->super_Var).size_,(port->super_Var).is_signed_);
      uVar7 = (*(port->super_Var).super_IRNode._vptr_IRNode[0x18])(port);
      (*(pVVar9->super_IRNode)._vptr_IRNode[0x19])(pVVar9,(ulong)(uVar7 & 0xff));
      pVVar9->explicit_array_ = (port->super_Var).explicit_array_;
    }
    else {
      sVar19 = Var::as<kratos::PortPackedStruct>((Var *)auStack_58);
      (**(code **)(*(long *)auStack_58 + 0x170))
                (auStack_78,auStack_58,
                 sVar19.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      Generator::var_packed
                (pGVar11,(string *)
                         &var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(shared_ptr<kratos::PackedStruct> *)auStack_78);
      if (packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
      }
      if (packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
    }
    Generator::get_var((Generator *)auStack_58,(string *)pGVar11);
    auVar13 = auStack_58;
    if (packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    if ((process_port(kratos::Generator*,kratos::Port*,std::__cxx11::string_const&)::cast_maps ==
         '\0') &&
       (iVar6 = __cxa_guard_acquire(&process_port(kratos::Generator*,kratos::Port*,std::__cxx11::string_const&)
                                     ::cast_maps), iVar6 != 0)) {
      packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x500000003;
      auStack_58 = (undefined1  [8])0x200000001;
      packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x300000002;
      std::
      _Hashtable<kratos::PortType,std::pair<kratos::PortType_const,kratos::VarCastType>,std::allocator<std::pair<kratos::PortType_const,kratos::VarCastType>>,std::__detail::_Select1st,std::equal_to<kratos::PortType>,std::hash<kratos::PortType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_Hashtable<std::pair<kratos::PortType_const,kratos::VarCastType>const*>
                ((_Hashtable<kratos::PortType,std::pair<kratos::PortType_const,kratos::VarCastType>,std::allocator<std::pair<kratos::PortType_const,kratos::VarCastType>>,std::__detail::_Select1st,std::equal_to<kratos::PortType>,std::hash<kratos::PortType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&process_port::cast_maps,auStack_58,local_38,0,auStack_78,&local_e8,local_d0);
      __cxa_atexit(std::
                   unordered_map<kratos::PortType,_kratos::VarCastType,_std::hash<kratos::PortType>,_std::equal_to<kratos::PortType>,_std::allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_>_>
                   ::~unordered_map,&process_port::cast_maps,&__dso_handle);
      __cxa_guard_release(&process_port(kratos::Generator*,kratos::Port*,std::__cxx11::string_const&)
                           ::cast_maps);
    }
    PVar1 = port->type_;
    p_Var14 = process_port::cast_maps._M_h._M_buckets
              [(ulong)(long)(int)PVar1 % process_port::cast_maps._M_h._M_bucket_count];
    p_Var15 = (__node_base_ptr)0x0;
    if ((p_Var14 != (__node_base_ptr)0x0) &&
       (p_Var2 = p_Var14->_M_nxt, p_Var15 = p_Var14,
       PVar1 != *(PortType *)&p_Var14->_M_nxt[1]._M_nxt)) {
      while (p_Var14 = p_Var2, p_Var2 = p_Var14->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
        p_Var15 = (__node_base_ptr)0x0;
        if (((ulong)(long)(int)*(PortType *)&p_Var2[1]._M_nxt %
             process_port::cast_maps._M_h._M_bucket_count !=
             (ulong)(long)(int)PVar1 % process_port::cast_maps._M_h._M_bucket_count) ||
           (p_Var15 = p_Var14, PVar1 == *(PortType *)&p_Var2[1]._M_nxt)) goto LAB_0022366d;
      }
      p_Var15 = (__node_base_ptr)0x0;
    }
LAB_0022366d:
    if ((p_Var15 != (__node_base_ptr)0x0) && (p_Var15->_M_nxt != (_Hash_node_base *)0x0)) {
      auStack_78._0_4_ = PVar1;
      std::__detail::
      _Map_base<kratos::PortType,_std::pair<const_kratos::PortType,_kratos::VarCastType>,_std::allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_>,_std::__detail::_Select1st,_std::equal_to<kratos::PortType>,_std::hash<kratos::PortType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::at((_Map_base<kratos::PortType,_std::pair<const_kratos::PortType,_kratos::VarCastType>,_std::allocator<std::pair<const_kratos::PortType,_kratos::VarCastType>_>,_std::__detail::_Select1st,_std::equal_to<kratos::PortType>,_std::hash<kratos::PortType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            *)&process_port::cast_maps,(key_type *)auStack_78);
      Var::cast((Var *)auStack_58,auVar13._0_4_);
      auVar13 = auStack_58;
      if (packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
    }
    if (pGVar11->debug == true) {
      std::
      vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
      ::
      vector<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
                ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                  *)auStack_78,
                 (port->super_Var).super_IRNode.fn_name_ln.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (port->super_Var).super_IRNode.fn_name_ln.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_e8);
      local_38 = (undefined1  [8])&(((Var *)auVar13)->super_IRNode).fn_name_ln;
      auStack_58 = (undefined1  [8])
                   (((Var *)auVar13)->super_IRNode).fn_name_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (((Var *)auVar13)->super_IRNode).fn_name_ln.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (((Var *)auVar13)->super_IRNode).fn_name_ln.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (((Var *)auVar13)->super_IRNode).fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_78;
      (((Var *)auVar13)->super_IRNode).fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)packed_1.
                    super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (((Var *)auVar13)->super_IRNode).fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)packed_1.
                    super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      auStack_78 = (undefined1  [8])0x0;
      packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)auStack_58);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)auStack_78);
      auStack_58 = (undefined1  [8])0x261053;
      packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._4_4_,0x194);
      std::
      vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::pair<char_const*,int>>
                ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                  *)local_38,(pair<const_char_*,_int> *)auStack_58);
    }
    Var::move_src_to(&port->super_Var,(Var *)auVar13,pGVar11,true);
    if (var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&new_name._M_string_length) {
      operator_delete(var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi,new_name._M_string_length + 1);
    }
    return;
  }
  local_38 = (undefined1  [8])port_name;
  iVar6 = (*(port->super_Var).super_IRNode._vptr_IRNode[0xe])(port);
  var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_90;
  new_name._M_dataplus._M_p = (pointer)0x1;
  new_name._M_string_length = 0;
  new_name.field_2._M_allocated_capacity = 0;
  new_name.field_2._8_4_ = 0x3f800000;
  auStack_90._0_8_ = (_func_int **)0x0;
  plVar17 = *(long **)(CONCAT44(extraout_var_01,iVar6) + 0x10);
  if (plVar17 != (long *)0x0) {
    do {
      pGVar11 = Stmt::generator_parent((Stmt *)plVar17[1]);
      iVar6 = (*(port->super_Var).super_IRNode._vptr_IRNode[0xd])(port);
      if (pGVar11 == *(Generator **)(CONCAT44(extraout_var_02,iVar6) + 0x2d0)) {
        std::
        _Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::_M_emplace<std::shared_ptr<kratos::AssignStmt>const&>
                  ((_Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   plVar17 + 1);
      }
      plVar17 = (long *)*plVar17;
    } while (plVar17 != (long *)0x0);
  }
  if (new_name.field_2._M_allocated_capacity == 0) goto LAB_00223a55;
  if (new_name.field_2._M_allocated_capacity == 1) {
    auStack_90._8_8_ = *(long *)(new_name._M_string_length + 8);
    local_80 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(new_name._M_string_length + 0x10);
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_80->_M_use_count = local_80->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_80->_M_use_count = local_80->_M_use_count + 1;
      }
    }
    ppVar3 = *(pointer *)(auStack_90._8_8_ + 0xc0);
    cVar5 = (**(code **)((ppVar3->first)._M_dataplus._M_p + 0xe8))(ppVar3);
    if (cVar5 == '\0') {
      ppVar16 = ppVar3;
      if (*(int *)&ppVar3[9].first._M_dataplus._M_p == 6) {
        Var::as<kratos::VarCasted>((Var *)auStack_58);
        ppVar16 = (((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     *)((long)auStack_58 + 0x278))->
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
        }
      }
      switch(*(undefined4 *)&ppVar16[9].first._M_dataplus._M_p) {
      case 0:
      case 3:
      case 5:
        goto switchD_00223812_caseD_0;
      default:
        bVar18 = true;
        break;
      case 4:
        lVar10 = (**(code **)((ppVar16->first)._M_dataplus._M_p + 0x20))(ppVar16);
        iVar6 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
        bVar18 = lVar10 != CONCAT44(extraout_var_05,iVar6);
      }
    }
    else {
switchD_00223812_caseD_0:
      bVar18 = false;
    }
    lVar10 = (**(code **)(*(long *)auStack_90._8_8_ + 0x20))();
    if (!bVar18 && *(int *)(lVar10 + 0x48) == 0) {
      lVar10 = (**(code **)((ppVar3->first)._M_dataplus._M_p + 0x68))(ppVar3);
      iVar6 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
      if ((lVar10 == CONCAT44(extraout_var_03,iVar6)) &&
         (*(Port **)(auStack_90._8_8_ + 200) == port)) {
        (**(code **)(*(long *)auStack_90._8_8_ + 0x48))();
        if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
        }
        goto LAB_00223a55;
      }
    }
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    }
  }
  iVar6 = (*(generator->super_IRNode)._vptr_IRNode[4])(generator);
  pGVar11 = (Generator *)CONCAT44(extraout_var_04,iVar6);
  if (pGVar11 == (Generator *)0x0) {
    pGVar12 = (GeneratorException *)__cxa_allocate_exception(0x10);
    auStack_78 = (undefined1  [8])(generator->name)._M_dataplus._M_p;
    packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(generator->name)._M_string_length;
    format_str_00.size_ = 0xd;
    format_str_00.data_ = (char *)0x2f;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_78;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)auStack_58,(detail *)"{0}\'s parent is empty but it\'s not a top module",
               format_str_00,args_00);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_e8;
    local_e8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)generator;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_78,__l_00,
               (allocator_type *)local_d0);
    GeneratorException::GeneratorException
              (pGVar12,(string *)auStack_58,
               (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_78);
    __cxa_throw(pGVar12,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
  }
  Generator::get_unique_variable_name
            ((string *)auStack_58,pGVar11,&generator->instance_name,(string *)local_38);
  iVar6 = (*(port->super_Var).super_IRNode._vptr_IRNode[0x17])(port);
  if ((char)iVar6 == '\0') {
    pVVar9 = Generator::var(pGVar11,(string *)auStack_58,(port->super_Var).var_width_,
                            &(port->super_Var).size_,(port->super_Var).is_signed_);
    uVar7 = (*(port->super_Var).super_IRNode._vptr_IRNode[0x18])(port);
    (*(pVVar9->super_IRNode)._vptr_IRNode[0x19])(pVVar9,(ulong)(uVar7 & 0xff));
    pVVar9->explicit_array_ = (port->super_Var).explicit_array_;
  }
  else {
    sVar19 = Var::as<kratos::PortPackedStruct>((Var *)auStack_78);
    (**(code **)((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_78)
                 ->_M_dataplus)._M_p + 0x170))
              (&local_e8,auStack_78,
               sVar19.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi);
    Generator::var_packed
              (pGVar11,(string *)auStack_58,(shared_ptr<kratos::PackedStruct> *)&local_e8);
    if (local_e8.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_e8.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
  }
  Generator::get_var((Generator *)local_d0,(string *)pGVar11);
  if (pGVar11->debug == true) {
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::
    vector<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&local_e8,
               (port->super_Var).super_IRNode.fn_name_ln.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (port->super_Var).super_IRNode.fn_name_ln.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_59);
    auStack_78 = (undefined1  [8])
                 (((IRNode *)local_d0)->fn_name_ln).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (((IRNode *)local_d0)->fn_name_ln).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (((IRNode *)local_d0)->fn_name_ln).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (((IRNode *)local_d0)->fn_name_ln).
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_e8.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (((IRNode *)local_d0)->fn_name_ln).
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_e8.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (((IRNode *)local_d0)->fn_name_ln).
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_e8.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)auStack_78);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~vector(&local_e8);
    auStack_78 = (undefined1  [8])0x261053;
    packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(packed_1.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr._4_4_,0x1cd);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&((IRNode *)local_d0)->fn_name_ln,(pair<const_char_*,_int> *)auStack_78);
  }
  Var::move_sink_to(&port->super_Var,(Var *)local_d0,pGVar11,true);
  if (var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (auStack_58 !=
      (undefined1  [8])
      &packed.super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  {
    operator_delete((void *)auStack_58,
                    (ulong)((long)&(packed.
                                    super___shared_ptr<kratos::PortPackedStruct,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
LAB_00223a55:
  std::
  _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

static void process_port(Generator* generator, Port* port, const std::string& port_name) {
        auto const port_direction = port->port_direction();
        if (port_direction == PortDirection::In) {
            const auto& sources = port->sources();
            // unless it's driven by a single var or port, we need to duplicate
            // the variable
            if (sources.size() == 1) {
                const auto& stmt = *sources.begin();
                if (stmt->parent()->ir_node_kind() == IRNodeKind::GeneratorKind &&
                    stmt->left() == port) {
                    // the sink has to be it self
                    auto* src = stmt->right();
                    if (correct_src_type(src, generator) ||
                        // here we are okay with input sliced in
                        (src->type() == VarType::Slice &&
                         src->generator() == generator->parent())) {
                        // remove it from the parent generator
                        src->generator()->remove_stmt(stmt);
                        return;
                    }
                }
            }
            // create a new variable
            auto* ast_parent = generator->parent();
            if (!ast_parent)
                throw GeneratorException(
                    ::format("{0}'s parent is empty but it's not a top module", generator->name),
                    {generator});
            auto* parent = reinterpret_cast<Generator*>(ast_parent);
            auto new_name = parent->get_unique_variable_name(generator->instance_name, port_name);
            if (port->is_struct()) {
                auto packed = port->as<PortPackedStruct>();
                parent->var_packed(new_name, packed->packed_struct());
            } else {
                auto& v = parent->var(new_name, port->var_width(), port->size(), port->is_signed());
                v.set_is_packed(port->is_packed());
                v.set_explicit_array(port->explicit_array());
            }
            Var* var = parent->get_var(new_name).get();
            // be careful about the port type. if it's special type, it needs properly casted
            const static std::unordered_map<PortType, VarCastType> cast_maps = {
                {PortType::Clock, VarCastType::Clock},
                {PortType::AsyncReset, VarCastType::AsyncReset},
                {PortType::Reset, VarCastType::Reset},
                {PortType::ClockEnable, VarCastType::ClockEnable}};
            if (cast_maps.find(port->port_type()) != cast_maps.end()) {
                var = var->cast(cast_maps.at(port->port_type())).get();
            }
            if (parent->debug) {
                // need to copy over the changes over
                var->fn_name_ln = std::vector<std::pair<std::string, uint32_t>>(
                    port->fn_name_ln.begin(), port->fn_name_ln.end());
                var->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
            // replace all the sources
            Var::move_src_to(port, var, parent, true);
        } else if (port_direction == PortDirection::Out) {
            // same logic as the port dir in
            // if we're connected to a base variable, we are good
            const auto& sinks_ = port->sinks();
            // we are only interested in parent level port connection
            std::unordered_set<std::shared_ptr<AssignStmt>> sinks;
            for (auto const& stmt : sinks_) {
                if (stmt->generator_parent() == port->generator()->parent_generator())
                    sinks.emplace(stmt);
            }
            if (sinks.empty()) {
                return;
            }
            // special case where if the sink is parent's port, this is fine
            if (sinks.size() == 1) {
                auto stmt = *(sinks.begin());
                auto* src = stmt->left();
                bool correct_src_type_;
                if (!src->is_interface()) {
                    // as long as it is not an expression, it is fine
                    correct_src_type_ = correct_src_type(src, generator);
                } else {
                    correct_src_type_ = true;
                }
                if (stmt->parent()->ir_node_kind() == IRNodeKind::GeneratorKind &&
                    correct_src_type_ && src->generator() == generator->parent() &&
                    stmt->right() == port) {
                    // remove it from the parent generator
                    stmt->remove_from_parent();
                    return;
                }
            }
            // create a new variable
            auto* ast_parent = generator->parent();
            if (!ast_parent)
                throw GeneratorException(
                    ::format("{0}'s parent is empty but it's not a top module", generator->name),
                    {generator});
            auto* parent = reinterpret_cast<Generator*>(ast_parent);
            auto new_name = parent->get_unique_variable_name(generator->instance_name, port_name);
            if (port->is_struct()) {
                auto packed = port->as<PortPackedStruct>();
                parent->var_packed(new_name, packed->packed_struct());
            } else {
                auto& v = parent->var(new_name, port->var_width(), port->size(), port->is_signed());
                v.set_is_packed(port->is_packed());
                v.set_explicit_array(port->explicit_array());
            }
            auto var = parent->get_var(new_name);
            if (parent->debug) {
                // need to copy over the changes over
                var->fn_name_ln = std::vector<std::pair<std::string, uint32_t>>(
                    port->fn_name_ln.begin(), port->fn_name_ln.end());
                var->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
            // replace all the sources
            Var::move_sink_to(port, var.get(), parent, true);
        } else {
            throw InternalException("Not implement yet");
        }
    }